

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O0

void nk_glfw3_device_destroy(nk_glfw *glfw)

{
  long in_RDI;
  nk_glfw_device *dev;
  
  (*glad_glDetachShader)(*(GLuint *)(in_RDI + 0xac),*(GLuint *)(in_RDI + 0xb0));
  (*glad_glDetachShader)(*(GLuint *)(in_RDI + 0xac),*(GLuint *)(in_RDI + 0xb4));
  (*glad_glDeleteShader)(*(GLuint *)(in_RDI + 0xb0));
  (*glad_glDeleteShader)(*(GLuint *)(in_RDI + 0xb4));
  (*glad_glDeleteProgram)(*(GLuint *)(in_RDI + 0xac));
  (*glad_glDeleteTextures)(1,(GLuint *)(in_RDI + 0xcc));
  (*glad_glDeleteBuffers)(1,(GLuint *)(in_RDI + 0xa0));
  (*glad_glDeleteBuffers)(1,(GLuint *)(in_RDI + 0xa8));
  nk_buffer_free((nk_buffer *)0x145e41);
  return;
}

Assistant:

NK_API void
nk_glfw3_device_destroy(struct nk_glfw* glfw)
{
    struct nk_glfw_device *dev = &glfw->ogl;
    glDetachShader(dev->prog, dev->vert_shdr);
    glDetachShader(dev->prog, dev->frag_shdr);
    glDeleteShader(dev->vert_shdr);
    glDeleteShader(dev->frag_shdr);
    glDeleteProgram(dev->prog);
    glDeleteTextures(1, &dev->font_tex);
    glDeleteBuffers(1, &dev->vbo);
    glDeleteBuffers(1, &dev->ebo);
    nk_buffer_free(&dev->cmds);
}